

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::BufferStorage::MapPersistentReadPixelsTest::iterate(MapPersistentReadPixelsTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  char *description;
  qpTestResult testResult;
  MoveMapOwner MVar6;
  Texture texture;
  Framebuffer framebuffer;
  Buffer buffer;
  MapOwner tmp;
  MapOwner map;
  code *local_238;
  GLenum local_230;
  GLubyte updated_texture_data [64];
  GLubyte initial_texture_data [64];
  undefined1 local_1a8 [384];
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  lVar4 = 0;
  lVar5 = 0x40;
  while (lVar5 != 0) {
    initial_texture_data[lVar4] = (GLubyte)lVar4;
    updated_texture_data[lVar4] = (GLubyte)lVar5;
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + -1;
  }
  texture.m_context = (this->super_TestCase).m_context;
  buffer.m_id = 0xffffffff;
  buffer.m_target = 0x8892;
  framebuffer.m_id = 0xffffffff;
  texture.m_id = 0xffffffff;
  framebuffer.m_context = texture.m_context;
  buffer.m_context = texture.m_context;
  BufferStorage::Buffer::InitStorage(&buffer,0x88eb,0x43,0x40,(GLvoid *)0x0);
  BufferStorage::Texture::Generate(gl,&texture.m_id);
  BufferStorage::Texture::Bind(gl,texture.m_id,0xde1);
  testResult = QP_TEST_RESULT_FAIL;
  BufferStorage::Texture::Storage(gl,0xde1,1,0x8232,8,8,0);
  BufferStorage::Texture::SubImage(gl,0xde1,0,0,0,0,8,8,0,0x8d94,0x1401,initial_texture_data);
  BufferStorage::Framebuffer::Generate(gl,&framebuffer.m_id);
  BufferStorage::Framebuffer::Bind(gl,0x8ca8,framebuffer.m_id);
  BufferStorage::Framebuffer::AttachTexture(gl,0x8ca8,0x8ce0,texture.m_id,8,8);
  BufferStorage::Buffer::Bind(&buffer);
  (*gl->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"ReadPixels to not mapped PIXEL_PACK buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb2b);
  BufferStorage::Texture::SubImage(gl,0xde1,0,0,0,0,8,8,0,0x8d94,0x1401,updated_texture_data);
  MVar6 = BufferStorage::Buffer::MapRange(&buffer,0,0x40,0x43);
  map.m_buffer = MVar6.buffer;
  map.m_data = MVar6.data;
  BufferStorage::Buffer::Bind(&buffer);
  (*gl->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"ReadPixels to persistently mapped PIXEL_PACK buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb42);
  (*gl->memoryBarrier)(0x4000);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb45);
  (*gl->finish)();
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb48);
  iVar2 = bcmp(updated_texture_data,MVar6.data,0x40);
  if (iVar2 != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Wrong contents of persistently mapped PIXEL_PACK buffer after ReadPixels");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  BufferStorage::Buffer::MapOwner::~MapOwner(&map);
  MVar6 = BufferStorage::Buffer::MapRange(&buffer,0,0x40,3);
  tmp.m_data = MVar6.data;
  tmp.m_buffer = MVar6.buffer;
  BufferStorage::Buffer::Bind(&buffer);
  (*gl->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  GVar3 = (*gl->getError)();
  if (GVar3 == 0x502) {
    BufferStorage::Buffer::MapOwner::~MapOwner(&tmp);
    if (iVar2 == 0) {
      testResult = QP_TEST_RESULT_PASS;
      description = "Pass";
      goto LAB_0094157e;
    }
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Wrong error was generated by ReadPixels. Expected INVALID_OPERATION as PIXEL_PACK buffer is mapped. Got: "
                   );
    local_238 = glu::getErrorName;
    local_230 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&map,&local_238);
    std::operator<<((ostream *)poVar1,(char *)map.m_data);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&map);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    BufferStorage::Buffer::MapOwner::~MapOwner(&tmp);
  }
  description = "Fail";
LAB_0094157e:
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,testResult,description);
  BufferStorage::Texture::~Texture(&texture);
  BufferStorage::Framebuffer::~Framebuffer(&framebuffer);
  BufferStorage::Buffer::~Buffer(&buffer);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapPersistentReadPixelsTest::iterate()
{
	static const GLuint height	= 8;
	static const GLuint width	 = 8;
	static const size_t data_size = width * height;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/* Prepare data */
	GLubyte initial_texture_data[data_size];
	GLubyte updated_texture_data[data_size];

	for (size_t i = 0; i < data_size; ++i)
	{
		initial_texture_data[i] = (glw::GLubyte)i;
		updated_texture_data[i] = (glw::GLubyte)(data_size - i);
	}

	/* Prepare GL objects */
	Buffer		buffer(m_context);
	Framebuffer framebuffer(m_context);
	Texture		texture(m_context);

	buffer.InitStorage(GL_PIXEL_PACK_BUFFER, GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, data_size,
					   0 /* data */);

	Texture::Generate(gl, texture.m_id);
	Texture::Bind(gl, texture.m_id, GL_TEXTURE_2D);
	Texture::Storage(gl, GL_TEXTURE_2D, 1 /* levels */, GL_R8UI, width, height, 0 /* depth */);
	Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, 0 /* depth */,
					  GL_RED_INTEGER, GL_UNSIGNED_BYTE, initial_texture_data);

	Framebuffer::Generate(gl, framebuffer.m_id);
	Framebuffer::Bind(gl, GL_READ_FRAMEBUFFER, framebuffer.m_id);
	Framebuffer::AttachTexture(gl, GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture.m_id, width, height);

	/*
	 * - execute ReadPixels to transfer texture contents to buffer, no error should
	 * be generated;
	 */
	buffer.Bind();
	gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
				  0 /* offset in PIXEL_PACK_BUFFER */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels to not mapped PIXEL_PACK buffer");

	/*
	 * - update contents of texture with different image;
	 * - map buffer contents with MapBufferRange, <access> should contain
	 * MAP_PERSISTENT_BIT, MAP_READ_BIT and MAP_WRITE_BIT;
	 * - execute ReadPixels to transfer texture contents to buffer, no error should
	 * be generated;
	 * - execute MemoryBarrier with CLIENT_MAPPED_BUFFER_BARRIER_BIT and Finish;
	 * - inspect contents of mapped buffer, to verify that latest data transfer was
	 * successful;
	 * - unmap buffer
	 */
	{
		Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height,
						  0 /* depth */, GL_RED_INTEGER, GL_UNSIGNED_BYTE, updated_texture_data);

		const Buffer::MapOwner map(
			buffer.MapRange(0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));

		buffer.Bind();
		gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
					  0 /* offset in PIXEL_PACK_BUFFER */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels to persistently mapped PIXEL_PACK buffer");

		gl.memoryBarrier(GL_CLIENT_MAPPED_BUFFER_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(updated_texture_data, map.m_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Wrong contents of persistently mapped PIXEL_PACK buffer after ReadPixels"
				<< tcu::TestLog::EndMessage;
		}
	}

	/*
	 * - map buffer contents again, this time do not provide MAP_PERSISTENT_BIT;
	 * - execute ReadPixels to transfer texture contents to buffer,
	 * INVALID_OPERATION error should be generated.
	 */
	{
		Buffer::MapOwner tmp(buffer.MapRange(0 /* offset */, data_size, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));

		buffer.Bind();
		gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
					  0 /* offset in PIXEL_PACK_BUFFER */);
		GLenum error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Wrong error was generated by ReadPixels. Expected INVALID_OPERATION as "
											"PIXEL_PACK buffer is mapped. Got: "
				<< glu::getErrorStr(error).toString().c_str() << tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}